

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CMU462::Viewer::drawInfo(void)

{
  Color color;
  OSDText *pOVar1;
  int iVar2;
  string local_160;
  allocator<char> local_139;
  string local_138 [8];
  string renderer_info_1;
  string local_f8 [8];
  string renderer_info;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string framerate_info;
  undefined1 auStack_38 [8];
  Color c;
  duration<double,_std::ratio<1L,_1L>_> local_20;
  rep_conflict local_18;
  double elapsed;
  
  sys_curr = (double)std::chrono::_V2::system_clock::now();
  elapsed = sys_curr;
  c._8_8_ = std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&sys_curr,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&sys_last);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_20,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&c.b);
  local_18 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_20);
  if (local_18 < 1.0) {
    framecount = framecount + 1;
  }
  else {
    if (framecount < 0x14) {
      Color::Color((Color *)auStack_38,1.0,0.35,0.35,1.0);
    }
    else {
      Color::Color((Color *)auStack_38,0.15,0.5,0.15,1.0);
    }
    framerate_info.field_2._8_8_ = auStack_38;
    color.b = c.r;
    color.a = c.g;
    color.r = (float)auStack_38._0_4_;
    color.g = (float)auStack_38._4_4_;
    OSDText::set_color(osd_text,line_id_framerate,color);
    std::__cxx11::to_string(&local_a8,framecount);
    std::operator+(&local_88,"Framerate: ",&local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   &local_88," fps");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    iVar2 = line_id_framerate;
    pOVar1 = osd_text;
    std::__cxx11::string::string
              ((string *)(renderer_info.field_2._M_local_buf + 8),(string *)local_68);
    OSDText::set_text(pOVar1,iVar2,(string *)((long)&renderer_info.field_2 + 8));
    std::__cxx11::string::~string((string *)(renderer_info.field_2._M_local_buf + 8));
    framecount = 0;
    sys_last = sys_curr;
    std::__cxx11::string::~string((string *)local_68);
  }
  if (renderer == (long *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_138,"No input renderer",&local_139);
    std::allocator<char>::~allocator(&local_139);
    iVar2 = line_id_renderer;
    pOVar1 = osd_text;
    std::__cxx11::string::string((string *)&local_160,local_138);
    OSDText::set_text(pOVar1,iVar2,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string(local_138);
  }
  else {
    (**(code **)(*renderer + 0x30))();
    iVar2 = line_id_renderer;
    pOVar1 = osd_text;
    std::__cxx11::string::string((string *)(renderer_info_1.field_2._M_local_buf + 8),local_f8);
    OSDText::set_text(pOVar1,iVar2,(string *)((long)&renderer_info_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(renderer_info_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_f8);
  }
  OSDText::render(osd_text);
  return;
}

Assistant:

void Viewer::drawInfo() {

  // compute timers - fps is update every second
  sys_curr = system_clock::now();
  double elapsed = ((duration<double>) (sys_curr - sys_last)).count();
  if (elapsed >= 1.0f) {

    // update framecount OSD
    Color c = framecount < 20 ? Color(1.0, 0.35, 0.35) : Color(0.15, 0.5, 0.15);
    osd_text->set_color(line_id_framerate, c);
    string framerate_info = "Framerate: " + to_string(framecount) + " fps";
    osd_text->set_text(line_id_framerate, framerate_info);

    // reset timer and counter
    framecount = 0;
    sys_last = sys_curr; 

  } else {

    // increment framecount
    framecount++;
  
  }

  // udpate renderer OSD
  // TODO: This is done on every update and it shouldn't be!
  // The viewer should only update when the renderer needs to
  // update the info text. 
  if (renderer) {
    string renderer_info = renderer->info();
    osd_text->set_text(line_id_renderer, renderer_info);
  } else {
    string renderer_info = "No input renderer";
    osd_text->set_text(line_id_renderer, renderer_info);
  }

  // render OSD
  osd_text->render();

}